

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

void __thiscall
xemmai::ast::anon_unknown_11::f_emit_block
          (anon_unknown_11 *this,t_emit *a_emit,
          vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
          *a_nodes,bool a_tail,bool a_clear,bool a_preserve)

{
  ulong uVar1;
  pointer *ppuVar2;
  
  if (a_emit != (t_emit *)a_nodes) {
    ppuVar2 = &a_nodes[-1].
               super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((t_emit *)ppuVar2 != a_emit) {
      do {
        (**(code **)&a_emit->v_module->v_next->v_color)(a_emit->v_module,this,0,0,1);
        a_emit = (t_emit *)&a_emit->v_safe_points;
      } while (a_emit != (t_emit *)ppuVar2);
    }
    (**(code **)(*(long *)&((_Rep_type *)&a_emit->v_module->v_next)->_M_impl + 0x18))
              (a_emit->v_module,this,a_tail,0,a_clear);
    return;
  }
  if (!a_clear) {
    if (!a_preserve) {
      t_emit::f_emit_null((t_emit *)this);
      return;
    }
    uVar1 = *(long *)(this + 0x30) + 1;
    *(ulong *)(this + 0x30) = uVar1;
    if (*(ulong *)(*(long *)(this + 0x18) + 0x10) < uVar1) {
      *(ulong *)(*(long *)(this + 0x18) + 0x10) = uVar1;
    }
  }
  return;
}

Assistant:

void f_emit_block(t_emit& a_emit, const std::vector<std::unique_ptr<t_node>>& a_nodes, bool a_tail, bool a_clear, bool a_preserve = false)
{
	auto i = a_nodes.begin();
	auto j = a_nodes.end();
	if (i == j) {
		if (!a_clear) a_preserve ? a_emit.f_push() : a_emit.f_emit_null();
	} else {
		for (--j; i != j; ++i) (*i)->f_emit(a_emit, false, false, true);
		(*i)->f_emit(a_emit, a_tail, false, a_clear);
	}
}